

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

Vec_Int_t *
Saig_StrSimPerformMatching(Aig_Man_t *p0,Aig_Man_t *p1,int nDist,int fVerbose,Aig_Man_t **ppMiter)

{
  void *pvVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Man_t **ppAVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Vec_Int_t *p;
  int *piVar10;
  Aig_Man_t *pAVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  Aig_Man_t *pAVar15;
  Vec_Ptr_t *pVVar16;
  ulong uVar17;
  Aig_Man_t *pPart0;
  Aig_Man_t *pPart1;
  timespec ts;
  Aig_Man_t *local_70;
  Aig_Man_t *local_68;
  int local_5c;
  timespec local_58;
  int local_44;
  long local_40;
  Aig_Man_t **local_38;
  
  local_5c = fVerbose;
  local_44 = nDist;
  iVar6 = clock_gettime(3,&local_58);
  if (iVar6 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  Aig_ManRandom(1);
  if (p1 == (Aig_Man_t *)0x0) {
    if (local_5c != 0) {
      Aig_ManPrintStats(p0);
    }
    iVar6 = Saig_ManDemiterSimpleDiff(p0,&local_70,&local_68);
    if (iVar6 == 0) {
      Abc_Print((int)p0,"Demitering has failed.\n");
      return (Vec_Int_t *)0x0;
    }
  }
  else {
    local_70 = Aig_ManDupSimple(p0);
    local_68 = Aig_ManDupSimple(p1);
  }
  local_40 = lVar12;
  local_38 = ppMiter;
  if (local_5c == 0) {
    Saig_StrSimPrepareAig(local_70);
    Saig_StrSimPrepareAig(local_68);
    Saig_StrSimSetInitMatching(local_70,local_68);
  }
  else {
    Aig_ManPrintStats(local_70);
    Aig_ManPrintStats(local_68);
    Saig_StrSimPrepareAig(local_70);
    Saig_StrSimPrepareAig(local_68);
    pAVar11 = local_70;
    Saig_StrSimSetInitMatching(local_70,local_68);
    iVar6 = (int)pAVar11;
    Abc_Print(iVar6,"Allocated %6.2f MB to simulate the first AIG.\n",
              (double)local_70->vObjs->nSize * 16.0 * 4.0 * 9.5367431640625e-07);
    Abc_Print(iVar6,"Allocated %6.2f MB to simulate the second AIG.\n",
              (double)local_68->vObjs->nSize * 16.0 * 4.0 * 9.5367431640625e-07);
  }
  uVar17 = 0;
  do {
    iVar6 = clock_gettime(3,&local_58);
    if (iVar6 < 0) {
      lVar12 = 1;
    }
    else {
      lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
      lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_58.tv_sec * -1000000;
    }
    Saig_StrSimulateRound(local_70,local_68);
    uVar7 = Saig_StrSimDetectUnique(local_70,local_68);
    if (local_5c != 0) {
      uVar8 = Saig_StrSimCountMatchedFlops(local_70);
      pAVar11 = local_70;
      pAVar15 = local_70;
      uVar9 = Saig_StrSimCountMatchedNodes(local_70);
      iVar6 = (int)pAVar15;
      Abc_Print(iVar6,"%3d : Match =%6d.  FF =%6d. (%6.2f %%)  Node =%6d. (%6.2f %%)  ",
                ((double)(int)uVar8 * 100.0) / (double)pAVar11->nRegs,
                ((double)(int)uVar9 * 100.0) / (double)(pAVar11->nObjs[6] + pAVar11->nObjs[5]),
                uVar17,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
      Abc_Print(iVar6,"%s =","Time");
      iVar14 = 3;
      iVar6 = clock_gettime(3,&local_58);
      if (iVar6 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar13 + lVar12) / 1000000.0);
    }
  } while (((int)uVar17 != 0x14) && (uVar17 = (ulong)((int)uVar17 + 1), 0 < (int)uVar7));
  pvVar1 = local_70->pData2;
  pvVar2 = *(void **)((long)pvVar1 + 8);
  if (pvVar2 != (void *)0x0) {
    free(pvVar2);
  }
  free(pvVar1);
  local_70->pData2 = (void *)0x0;
  pvVar1 = local_68->pData2;
  pvVar2 = *(void **)((long)pvVar1 + 8);
  if (pvVar2 != (void *)0x0) {
    free(pvVar2);
  }
  free(pvVar1);
  local_68->pData2 = (void *)0x0;
  Aig_ManFanoutStart(local_70);
  Aig_ManFanoutStart(local_68);
  if (local_44 != 0) {
    Ssw_StrSimMatchingExtend(local_70,local_68,local_44,local_5c);
  }
  Saig_StrSimSetFinalMatching(local_70,local_68);
  pAVar11 = local_70;
  pVVar16 = local_70->vObjs;
  iVar6 = pVVar16->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar6 * 2 - 1U) {
    iVar14 = iVar6 * 2;
  }
  p->nSize = 0;
  p->nCap = iVar14;
  if (iVar14 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)iVar14 << 2);
  }
  p->pArray = piVar10;
  if (0 < iVar6) {
    lVar12 = 0;
    do {
      pAVar3 = (Aig_Obj_t *)pVVar16->pArray[lVar12];
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (pAVar11->pReprs != (Aig_Obj_t **)0x0)) {
        pAVar4 = pAVar11->pReprs[pAVar3->Id];
        if (pAVar4 != (Aig_Obj_t *)0x0) {
          if ((local_68->pReprs == (Aig_Obj_t **)0x0) || (pAVar3 != local_68->pReprs[pAVar4->Id])) {
            __assert_fail("pObj0 == Aig_ObjRepr(pPart1, pObj1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                          ,0x3bb,
                          "Vec_Int_t *Saig_StrSimPerformMatching(Aig_Man_t *, Aig_Man_t *, int, int, Aig_Man_t **)"
                         );
          }
          Vec_IntPush(p,pAVar3->Id);
          Vec_IntPush(p,pAVar4->Id);
          pAVar11 = local_70;
        }
      }
      lVar12 = lVar12 + 1;
      pVVar16 = pAVar11->vObjs;
    } while (lVar12 < pVVar16->nSize);
  }
  ppAVar5 = local_38;
  if (local_38 != (Aig_Man_t **)0x0) {
    pAVar11 = Saig_ManWindowExtractMiter(pAVar11,local_68);
    *ppAVar5 = pAVar11;
    pAVar11 = local_70;
  }
  lVar12 = local_40;
  Aig_ManFanoutStop(pAVar11);
  Aig_ManFanoutStop(local_68);
  Aig_ManStop(local_70);
  pAVar11 = local_68;
  Aig_ManStop(local_68);
  Abc_Print((int)pAVar11,"%s =","Total runtime");
  iVar14 = 3;
  iVar6 = clock_gettime(3,&local_58);
  if (iVar6 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar13 + lVar12) / 1000000.0);
  return p;
}

Assistant:

Vec_Int_t * Saig_StrSimPerformMatching( Aig_Man_t * p0, Aig_Man_t * p1, int nDist, int fVerbose, Aig_Man_t ** ppMiter )
{
    extern Aig_Man_t * Saig_ManWindowExtractMiter( Aig_Man_t * p0, Aig_Man_t * p1 );

    Vec_Int_t * vPairs;
    Aig_Man_t * pPart0, * pPart1;
    Aig_Obj_t * pObj0, * pObj1;
    int i, nMatches;
    abctime clk, clkTotal = Abc_Clock();
    Aig_ManRandom( 1 );
    // consider the case when a miter is given
    if ( p1 == NULL )
    {
        if ( fVerbose )
        {
            Aig_ManPrintStats( p0 );
        }
        // demiter the miter
        if ( !Saig_ManDemiterSimpleDiff( p0, &pPart0, &pPart1 ) )
        {
            Abc_Print( 1, "Demitering has failed.\n" );
            return NULL;
        }
    }
    else
    {
        pPart0 = Aig_ManDupSimple( p0 );
        pPart1 = Aig_ManDupSimple( p1 );
    }
    if ( fVerbose )
    {
        Aig_ManPrintStats( pPart0 );
        Aig_ManPrintStats( pPart1 );
    }
    // start simulation 
    Saig_StrSimPrepareAig( pPart0 );
    Saig_StrSimPrepareAig( pPart1 );
    Saig_StrSimSetInitMatching( pPart0, pPart1 );
    if ( fVerbose )
    {
        Abc_Print( 1, "Allocated %6.2f MB to simulate the first AIG.\n",
            1.0 * Aig_ManObjNumMax(pPart0) * SAIG_WORDS * sizeof(unsigned) / (1<<20) );
        Abc_Print( 1, "Allocated %6.2f MB to simulate the second AIG.\n",
            1.0 * Aig_ManObjNumMax(pPart1) * SAIG_WORDS * sizeof(unsigned) / (1<<20) );
    }
    // iterate matching
    nMatches = 1;
    for ( i = 0; nMatches > 0; i++ )
    {
        clk = Abc_Clock();
        Saig_StrSimulateRound( pPart0, pPart1 );
        nMatches = Saig_StrSimDetectUnique( pPart0, pPart1 );
        if ( fVerbose )
        {
            int nFlops = Saig_StrSimCountMatchedFlops(pPart0);
            int nNodes = Saig_StrSimCountMatchedNodes(pPart0);
            Abc_Print( 1, "%3d : Match =%6d.  FF =%6d. (%6.2f %%)  Node =%6d. (%6.2f %%)  ",
                i, nMatches,
                nFlops, 100.0*nFlops/Aig_ManRegNum(pPart0),
                nNodes, 100.0*nNodes/Aig_ManNodeNum(pPart0) );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( i == 20 )
            break;
    }
    // cleanup
    Vec_PtrFree( (Vec_Ptr_t *)pPart0->pData2 ); pPart0->pData2 = NULL;
    Vec_PtrFree( (Vec_Ptr_t *)pPart1->pData2 ); pPart1->pData2 = NULL;
    // extend the islands
    Aig_ManFanoutStart( pPart0 );
    Aig_ManFanoutStart( pPart1 );
    if ( nDist )
        Ssw_StrSimMatchingExtend( pPart0, pPart1, nDist, fVerbose );
    Saig_StrSimSetFinalMatching( pPart0, pPart1 );
//    Saig_StrSimSetContiguousMatching( pPart0, pPart1 );
    // copy the results into array
    vPairs = Vec_IntAlloc( 2*Aig_ManObjNumMax(pPart0) );
    Aig_ManForEachObj( pPart0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr(pPart0, pObj0);
        if ( pObj1 == NULL )
            continue;
        assert( pObj0 == Aig_ObjRepr(pPart1, pObj1) );
        Vec_IntPush( vPairs, pObj0->Id );
        Vec_IntPush( vPairs, pObj1->Id );
    }
    // this procedure adds matching of PO and LI
    if ( ppMiter )
        *ppMiter = Saig_ManWindowExtractMiter( pPart0, pPart1 );
    Aig_ManFanoutStop( pPart0 );
    Aig_ManFanoutStop( pPart1 );
    Aig_ManStop( pPart0 );
    Aig_ManStop( pPart1 );
    ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    return vPairs;
}